

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall Camera::ProcessKeyboard(Camera *this,Camera_Movement direction,GLfloat deltaTime)

{
  int in_ESI;
  vec<3,float,(glm::qualifier)0> *in_RDI;
  float in_XMM0_Da;
  vec<3,_float,_(glm::qualifier)0> vVar1;
  GLfloat velocity;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 in_stack_ffffffffffffff84;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_5c;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_3c;
  vec<3,_float,_(glm::qualifier)0> local_30;
  vec<3,_float,_(glm::qualifier)0> local_20;
  float local_14;
  int local_c;
  
  local_14 = *(float *)(in_RDI + 0x44) * in_XMM0_Da;
  local_c = in_ESI;
  if (in_ESI == 0) {
    vVar1 = glm::operator*((vec<3,_float,_(glm::qualifier)0> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
    local_30._0_8_ = vVar1._0_8_;
    local_20.field_0 = local_30.field_0;
    local_20.field_1 = local_30.field_1;
    local_30.field_2 = vVar1.field_2;
    local_20.field_2 = local_30.field_2;
    local_30 = vVar1;
    glm::vec<3,float,(glm::qualifier)0>::operator+=(in_RDI,&local_20);
  }
  if (local_c == 1) {
    vVar1 = glm::operator*((vec<3,_float,_(glm::qualifier)0> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
    local_50._0_8_ = vVar1._0_8_;
    local_3c.field_0 = local_50.field_0;
    local_3c.field_1 = local_50.field_1;
    local_50.field_2 = vVar1.field_2;
    local_3c.field_2 = local_50.field_2;
    local_50 = vVar1;
    glm::vec<3,float,(glm::qualifier)0>::operator-=(in_RDI,&local_3c);
  }
  if (local_c == 2) {
    vVar1 = glm::operator*((vec<3,_float,_(glm::qualifier)0> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
    local_70._0_8_ = vVar1._0_8_;
    local_5c.field_0 = local_70.field_0;
    local_5c.field_1 = local_70.field_1;
    local_70.field_2 = vVar1.field_2;
    local_5c.field_2 = local_70.field_2;
    glm::vec<3,float,(glm::qualifier)0>::operator-=(in_RDI,&local_5c);
  }
  if (local_c == 3) {
    glm::operator*((vec<3,_float,_(glm::qualifier)0> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
    glm::vec<3,float,(glm::qualifier)0>::operator+=
              (in_RDI,(vec<3,_float,_(glm::qualifier)0> *)&stack0xffffffffffffff84);
  }
  return;
}

Assistant:

void Camera::ProcessKeyboard(Camera_Movement direction, GLfloat deltaTime) {
    GLfloat velocity = MovementSpeed * deltaTime;
    if (direction == CAM_FORWARD) {
        Position += Front * velocity;
    }
    if (direction == CAM_BACKWARD) {
        Position -= Front * velocity;
    }
    if (direction == CAM_LEFT) {
        Position -= Right * velocity;
    }
    if (direction == CAM_RIGHT) {
        Position += Right * velocity;
    }
}